

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

size_t __thiscall
proto2_unittest::TestOneof2_NestedMessage::ByteSizeLong(TestOneof2_NestedMessage *this)

{
  RepeatedField<int> *this_00;
  int iVar1;
  long lVar2;
  anon_union_40_1_493b367e_for_TestOneof2_NestedMessage_3 aVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  this_00 = &(this->field_0)._impl_.corge_int_;
  sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(this_00);
  uVar4 = google::protobuf::internal::SooRep::size
                    (&this_00->soo_rep_,
                     (undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x4) ==
                     (undefined1  [40])0x0);
  sVar5 = uVar4 + sVar5;
  aVar3 = this->field_0;
  if (((undefined1  [40])aVar3 & (undefined1  [40])0x3) != (undefined1  [40])0x0) {
    if (((undefined1  [40])aVar3 & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
      sVar6 = ByteSizeLong((this->field_0)._impl_.child_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [40])aVar3 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
      uVar7 = (this->field_0)._impl_.moo_int_ | 1;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestOneof2_NestedMessage::ByteSizeLong() const {
  const TestOneof2_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestOneof2.NestedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 corge_int = 2;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_corge_int());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_corge_int_size());
      total_size += tag_size + data_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.TestOneof2.NestedMessage child = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // int64 moo_int = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_moo_int());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}